

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool CoreML::Specification::NeuralNetworkMultiArrayShapeMapping_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 2;
}

Assistant:

bool NeuralNetworkMultiArrayShapeMapping_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}